

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O0

void __thiscall deqp::egl::anon_unknown_0::MemoryAllocator::allocatePBuffer(MemoryAllocator *this)

{
  int iVar1;
  deUint32 dVar2;
  deBool dVar3;
  GLenum GVar4;
  size_type sVar5;
  Library *pLVar6;
  undefined4 extraout_var;
  iterator first;
  iterator last;
  void *pvVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Error *error;
  float alpha;
  float blue;
  float green;
  float red;
  EGLContext context;
  EGLSurface surface;
  EGLint attribList [5];
  EGLint height;
  EGLint width;
  Library *egl;
  bad_alloc *anon_var_0;
  MemoryAllocator *this_local;
  
  sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_pbuffers);
  std::vector<void_*,_std::allocator<void_*>_>::reserve(&this->m_pbuffers,sVar5 + 1);
  pLVar6 = EglTestContext::getLibrary(this->m_eglTestCtx);
  iVar1 = de::Random::getInt(&this->m_rnd,this->m_minWidth,this->m_maxWidth);
  attribList[1] = de::Random::getInt(&this->m_rnd,this->m_minHeight,this->m_maxHeight);
  surface._0_4_ = 0x3057;
  attribList[0] = 0x3056;
  attribList[2] = 0x3038;
  surface._4_4_ = iVar1;
  iVar1 = (*pLVar6->_vptr_Library[10])(pLVar6,this->m_display,this->m_config,&surface);
  context = (EGLContext)CONCAT44(extraout_var,iVar1);
  dVar2 = (*pLVar6->_vptr_Library[0x1f])();
  eglu::checkError(dVar2,"eglCreatePbufferSurface",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                   ,0xd2);
  std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_pbuffers,&context);
  if (((this->m_use & 1U) != 0) &&
     (sVar5 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_contexts), sVar5 != 0)) {
    first = std::vector<void_*,_std::allocator<void_*>_>::begin(&this->m_contexts);
    last = std::vector<void_*,_std::allocator<void_*>_>::end(&this->m_contexts);
    pvVar7 = de::Random::
             choose<void*,__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>>
                       (&this->m_rnd,
                        (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
                        first._M_current,
                        (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
                        last._M_current);
    fVar8 = de::Random::getFloat(&this->m_rnd);
    fVar9 = de::Random::getFloat(&this->m_rnd);
    fVar10 = de::Random::getFloat(&this->m_rnd);
    fVar11 = de::Random::getFloat(&this->m_rnd);
    do {
      (*pLVar6->_vptr_Library[0x27])(pLVar6,this->m_display,context,context,pvVar7);
      dVar2 = (*pLVar6->_vptr_Library[0x1f])();
      eglu::checkError(dVar2,"makeCurrent(m_display, surface, surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                       ,0xe0);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    (*(this->m_gl).clearColor)(fVar8,fVar9,fVar10,fVar11);
    GVar4 = (*(this->m_gl).getError)();
    glu::checkError(GVar4,"glClearColor()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                    ,0xe3);
    (*(this->m_gl).clear)(0x4000);
    GVar4 = (*(this->m_gl).getError)();
    glu::checkError(GVar4,"glClear()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                    ,0xe6);
    do {
      (*pLVar6->_vptr_Library[0x27])(pLVar6,this->m_display,0,0);
      dVar2 = (*pLVar6->_vptr_Library[0x1f])();
      eglu::checkError(dVar2,
                       "makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                       ,0xe8);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
  }
  return;
}

Assistant:

void MemoryAllocator::allocatePBuffer (void)
{
	// Reserve space for new allocations
	try
	{
		m_pbuffers.reserve(m_pbuffers.size() + 1);
	}
	catch (const std::bad_alloc&)
	{
		m_errorString	= "std::bad_alloc when allocating more space for testcase. Out of host memory.";
		m_failed		= true;
		return;
	}

	// Allocate pbuffer
	try
	{
		const Library&	egl				= m_eglTestCtx.getLibrary();
		const EGLint	width			= m_rnd.getInt(m_minWidth, m_maxWidth);
		const EGLint	height			= m_rnd.getInt(m_minHeight, m_maxHeight);
		const EGLint	attribList[]	=
		{
			EGL_WIDTH,	width,
			EGL_HEIGHT, height,
			EGL_NONE
		};

		EGLSurface		surface			= egl.createPbufferSurface(m_display, m_config, attribList);
		EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface");

		DE_ASSERT(surface != EGL_NO_SURFACE);

		m_pbuffers.push_back(surface);

		if (m_use && m_contexts.size() > 0)
		{
			EGLContext				context		= m_rnd.choose<EGLContext>(m_contexts.begin(), m_contexts.end());
			const float				red			= m_rnd.getFloat();
			const float				green		= m_rnd.getFloat();
			const float				blue		= m_rnd.getFloat();
			const float				alpha		= m_rnd.getFloat();

			EGLU_CHECK_CALL(egl, makeCurrent(m_display, surface, surface, context));

			m_gl.clearColor(red, green, blue, alpha);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearColor()");

			m_gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClear()");

			EGLU_CHECK_CALL(egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		}
	}
	catch (const eglu::Error& error)
	{
		if (error.getError() == EGL_BAD_ALLOC)
		{
			m_errorString	= "eglCreatePbufferSurface returned EGL_BAD_ALLOC";
			m_failed		= true;
			return;
		}
		else
			throw;
	}
}